

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_write.c
# Opt level: O0

tmsize_t TIFFWriteEncodedTile(TIFF *tif,uint32_t tile,void *data,tmsize_t cc)

{
  uint16_t uVar1;
  int iVar2;
  uint local_48;
  uint local_44;
  uint32_t howmany32;
  uint16_t sample;
  TIFFDirectory *td;
  tmsize_t cc_local;
  void *data_local;
  uint32_t tile_local;
  TIFF *tif_local;
  
  if (((tif->tif_flags & 0x40) == 0) &&
     (iVar2 = TIFFWriteCheck(tif,1,"TIFFWriteEncodedTile"), iVar2 == 0)) {
    return -1;
  }
  if (tile < (tif->tif_dir).td_nstrips) {
    if ((((tif->tif_flags & 0x10) == 0) || (tif->tif_rawdata == (uint8_t *)0x0)) &&
       (iVar2 = TIFFWriteBufferSetup(tif,(void *)0x0,-1), iVar2 == 0)) {
      return -1;
    }
    tif->tif_flags = tif->tif_flags | 0x100000;
    tif->tif_curtile = tile;
    tif->tif_curoff = 0;
    iVar2 = _TIFFReserveLargeEnoughWriteBuffer(tif,tile);
    if (iVar2 == 0) {
      tif_local = (TIFF *)0xffffffffffffffff;
    }
    else {
      tif->tif_rawcc = 0;
      tif->tif_rawcp = tif->tif_rawdata;
      if ((tif->tif_dir).td_imagelength < -((tif->tif_dir).td_tilelength - 1) - 1) {
        local_44 = ((tif->tif_dir).td_imagelength + ((tif->tif_dir).td_tilelength - 1)) /
                   (tif->tif_dir).td_tilelength;
      }
      else {
        local_44 = 0;
      }
      if (local_44 == 0) {
        TIFFErrorExtR(tif,"TIFFWriteEncodedTile","Zero tiles");
        tif_local = (TIFF *)0xffffffffffffffff;
      }
      else {
        tif->tif_row = (tile % local_44) * (tif->tif_dir).td_tilelength;
        if ((tif->tif_dir).td_imagewidth < -((tif->tif_dir).td_tilewidth - 1) - 1) {
          local_48 = ((tif->tif_dir).td_imagewidth + ((tif->tif_dir).td_tilewidth - 1)) /
                     (tif->tif_dir).td_tilewidth;
        }
        else {
          local_48 = 0;
        }
        if (local_48 == 0) {
          TIFFErrorExtR(tif,"TIFFWriteEncodedTile","Zero tiles");
          tif_local = (TIFF *)0xffffffffffffffff;
        }
        else {
          tif->tif_col = (tile % local_48) * (tif->tif_dir).td_tilewidth;
          if ((tif->tif_flags & 0x20) == 0) {
            iVar2 = (*tif->tif_setupencode)(tif);
            if (iVar2 == 0) {
              return -1;
            }
            tif->tif_flags = tif->tif_flags | 0x20;
          }
          tif->tif_flags = tif->tif_flags & 0xffffefff;
          if ((cc < 1) || (td = (TIFFDirectory *)cc, tif->tif_tilesize < cc)) {
            td = (TIFFDirectory *)tif->tif_tilesize;
          }
          if ((tif->tif_dir).td_compression == 1) {
            (*tif->tif_postdecode)(tif,(uint8_t *)data,(tmsize_t)td);
            if (((tif->tif_flags & (uint)(tif->tif_dir).td_fillorder) == 0) &&
               ((tif->tif_flags & 0x100) == 0)) {
              TIFFReverseBits((uint8_t *)data,(tmsize_t)td);
            }
            if ((0 < (long)td) &&
               (iVar2 = TIFFAppendToStrip(tif,tile,(uint8_t *)data,(tmsize_t)td), iVar2 == 0)) {
              return -1;
            }
            tif_local = (TIFF *)td;
          }
          else {
            uVar1 = (uint16_t)(tile / (tif->tif_dir).td_stripsperimage);
            iVar2 = (*tif->tif_preencode)(tif,uVar1);
            if (iVar2 == 0) {
              tif_local = (TIFF *)0xffffffffffffffff;
            }
            else {
              (*tif->tif_postdecode)(tif,(uint8_t *)data,(tmsize_t)td);
              iVar2 = (*tif->tif_encodetile)(tif,(uint8_t *)data,(tmsize_t)td,uVar1);
              if (iVar2 == 0) {
                tif_local = (TIFF *)0xffffffffffffffff;
              }
              else {
                iVar2 = (*tif->tif_postencode)(tif);
                if (iVar2 == 0) {
                  tif_local = (TIFF *)0xffffffffffffffff;
                }
                else {
                  if (((tif->tif_flags & (uint)(tif->tif_dir).td_fillorder) == 0) &&
                     ((tif->tif_flags & 0x100) == 0)) {
                    TIFFReverseBits(tif->tif_rawdata,tif->tif_rawcc);
                  }
                  if ((0 < tif->tif_rawcc) &&
                     (iVar2 = TIFFAppendToStrip(tif,tile,tif->tif_rawdata,tif->tif_rawcc),
                     iVar2 == 0)) {
                    return -1;
                  }
                  tif->tif_rawcc = 0;
                  tif->tif_rawcp = tif->tif_rawdata;
                  tif_local = (TIFF *)td;
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    TIFFErrorExtR(tif,"TIFFWriteEncodedTile","Tile %lu out of range, max %lu",(ulong)tile,
                  (ulong)(tif->tif_dir).td_nstrips);
    tif_local = (TIFF *)0xffffffffffffffff;
  }
  return (tmsize_t)tif_local;
}

Assistant:

tmsize_t TIFFWriteEncodedTile(TIFF *tif, uint32_t tile, void *data, tmsize_t cc)
{
    static const char module[] = "TIFFWriteEncodedTile";
    TIFFDirectory *td;
    uint16_t sample;
    uint32_t howmany32;

    if (!WRITECHECKTILES(tif, module))
        return ((tmsize_t)(-1));
    td = &tif->tif_dir;
    if (tile >= td->td_nstrips)
    {
        TIFFErrorExtR(tif, module, "Tile %lu out of range, max %lu",
                      (unsigned long)tile, (unsigned long)td->td_nstrips);
        return ((tmsize_t)(-1));
    }
    /*
     * Handle delayed allocation of data buffer.  This
     * permits it to be sized more intelligently (using
     * directory information).
     */
    if (!BUFFERCHECK(tif))
        return ((tmsize_t)(-1));

    tif->tif_flags |= TIFF_BUF4WRITE;

    tif->tif_curtile = tile;

    /* this informs TIFFAppendToStrip() we have changed or reset tile */
    tif->tif_curoff = 0;

    if (!_TIFFReserveLargeEnoughWriteBuffer(tif, tile))
    {
        return ((tmsize_t)(-1));
    }

    tif->tif_rawcc = 0;
    tif->tif_rawcp = tif->tif_rawdata;

    /*
     * Compute tiles per row & per column to compute
     * current row and column
     */
    howmany32 = TIFFhowmany_32(td->td_imagelength, td->td_tilelength);
    if (howmany32 == 0)
    {
        TIFFErrorExtR(tif, module, "Zero tiles");
        return ((tmsize_t)(-1));
    }
    tif->tif_row = (tile % howmany32) * td->td_tilelength;
    howmany32 = TIFFhowmany_32(td->td_imagewidth, td->td_tilewidth);
    if (howmany32 == 0)
    {
        TIFFErrorExtR(tif, module, "Zero tiles");
        return ((tmsize_t)(-1));
    }
    tif->tif_col = (tile % howmany32) * td->td_tilewidth;

    if ((tif->tif_flags & TIFF_CODERSETUP) == 0)
    {
        if (!(*tif->tif_setupencode)(tif))
            return ((tmsize_t)(-1));
        tif->tif_flags |= TIFF_CODERSETUP;
    }
    tif->tif_flags &= ~TIFF_POSTENCODE;

    /*
     * Clamp write amount to the tile size.  This is mostly
     * done so that callers can pass in some large number
     * (e.g. -1) and have the tile size used instead.
     */
    if (cc < 1 || cc > tif->tif_tilesize)
        cc = tif->tif_tilesize;

    /* shortcut to avoid an extra memcpy() */
    if (td->td_compression == COMPRESSION_NONE)
    {
        /* swab if needed - note that source buffer will be altered */
        tif->tif_postdecode(tif, (uint8_t *)data, cc);

        if (!isFillOrder(tif, td->td_fillorder) &&
            (tif->tif_flags & TIFF_NOBITREV) == 0)
            TIFFReverseBits((uint8_t *)data, cc);

        if (cc > 0 && !TIFFAppendToStrip(tif, tile, (uint8_t *)data, cc))
            return ((tmsize_t)-1);
        return (cc);
    }

    sample = (uint16_t)(tile / td->td_stripsperimage);
    if (!(*tif->tif_preencode)(tif, sample))
        return ((tmsize_t)(-1));
    /* swab if needed - note that source buffer will be altered */
    tif->tif_postdecode(tif, (uint8_t *)data, cc);

    if (!(*tif->tif_encodetile)(tif, (uint8_t *)data, cc, sample))
        return ((tmsize_t)-1);
    if (!(*tif->tif_postencode)(tif))
        return ((tmsize_t)(-1));
    if (!isFillOrder(tif, td->td_fillorder) &&
        (tif->tif_flags & TIFF_NOBITREV) == 0)
        TIFFReverseBits((uint8_t *)tif->tif_rawdata, tif->tif_rawcc);
    if (tif->tif_rawcc > 0 &&
        !TIFFAppendToStrip(tif, tile, tif->tif_rawdata, tif->tif_rawcc))
        return ((tmsize_t)(-1));
    tif->tif_rawcc = 0;
    tif->tif_rawcp = tif->tif_rawdata;
    return (cc);
}